

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EigenDecompositionSquare.hpp
# Opt level: O3

void __thiscall
beagle::cpu::EigenDecompositionSquare<float,_1>::updateTransitionMatricesWithModelCategories
          (EigenDecompositionSquare<float,_1> *this,int *eigenIndices,int *probabilityIndices,
          int *firstDerivativeIndices,int *secondDerivativeIndices,double *edgeLengths,
          float **transitionMatrices,int count)

{
  int iVar1;
  float *pfVar2;
  float *pfVar3;
  undefined1 auVar4 [16];
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  float *pfVar13;
  long lVar14;
  ulong uVar15;
  float *pfVar16;
  int k;
  ulong uVar17;
  float *pfVar18;
  int iVar19;
  int iVar20;
  float fVar21;
  float fVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  
  if (0 < count) {
    uVar10 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
    uVar8 = 0;
    do {
      if (0 < (int)uVar10) {
        lVar12 = 0;
        iVar9 = 0;
        pfVar2 = transitionMatrices[probabilityIndices[uVar8]];
        fVar21 = (float)edgeLengths[uVar8];
        uVar6 = (ulong)(uint)(this->super_EigenDecomposition<float,_1>).kStateCount;
        do {
          iVar5 = (int)uVar6;
          if (0 < iVar5) {
            iVar19 = 0;
            iVar1 = eigenIndices[lVar12];
            pfVar13 = this->gIMatrices[iVar1];
            pfVar18 = this->gEMatrices[iVar1];
            pfVar16 = (this->super_EigenDecomposition<float,_1>).gEigenValues[iVar1];
            do {
              if (this->isComplex == true) {
                fVar22 = pfVar16[(long)iVar5 + (long)iVar19];
                if ((fVar22 == 0.0) && (!NAN(fVar22))) goto LAB_0013e39c;
                iVar20 = iVar19 + 1;
                dVar24 = exp((double)(fVar21 * pfVar16[iVar19]));
                dVar23 = cos((double)(fVar21 * fVar22));
                dVar25 = sin((double)(fVar21 * fVar22));
                iVar1 = (this->super_EigenDecomposition<float,_1>).kStateCount;
                uVar6 = (ulong)iVar1;
                if (0 < (long)uVar6) {
                  pfVar3 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                  lVar7 = (long)(iVar1 * iVar20);
                  lVar14 = (long)(iVar19 * iVar1);
                  uVar10 = 0;
                  dVar23 = (double)(float)dVar24 * dVar23;
                  auVar26._0_4_ = (float)dVar23;
                  auVar26._4_4_ = (int)((ulong)dVar23 >> 0x20);
                  auVar26._8_8_ = 0;
                  fVar22 = (float)(dVar25 * (double)(float)dVar24);
                  do {
                    auVar4 = vfmadd231ss_fma(ZEXT416((uint)(fVar22 * pfVar13[lVar7 + uVar10])),
                                             auVar26,ZEXT416((uint)pfVar13[lVar14 + uVar10]));
                    pfVar3[lVar14 + uVar10] = auVar4._0_4_;
                    auVar4 = vfmsub231ss_fma(ZEXT416((uint)(fVar22 * pfVar13[lVar14 + uVar10])),
                                             auVar26,ZEXT416((uint)pfVar13[lVar7 + uVar10]));
                    pfVar3[lVar7 + uVar10] = auVar4._0_4_;
                    uVar10 = uVar10 + 1;
                  } while (uVar6 != uVar10);
                }
              }
              else {
LAB_0013e39c:
                dVar23 = exp((double)(fVar21 * pfVar16[iVar19]));
                iVar1 = (this->super_EigenDecomposition<float,_1>).kStateCount;
                uVar6 = (ulong)iVar1;
                iVar20 = iVar19;
                if (0 < (long)uVar6) {
                  uVar10 = 0;
                  lVar7 = (long)(iVar1 * iVar19);
                  pfVar3 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                  do {
                    pfVar3[lVar7 + uVar10] = (float)dVar23 * pfVar13[lVar7 + uVar10];
                    uVar10 = uVar10 + 1;
                  } while (uVar6 != uVar10);
                }
              }
              iVar19 = iVar20 + 1;
            } while (iVar19 < (int)uVar6);
            if (0 < (int)uVar6) {
              uVar10 = uVar6 & 0xffffffff;
              uVar11 = 0;
              do {
                pfVar13 = (this->super_EigenDecomposition<float,_1>).matrixTmp;
                uVar15 = 0;
                lVar7 = (long)iVar9;
                do {
                  lVar14 = lVar7;
                  auVar26 = ZEXT816(0) << 0x40;
                  uVar17 = 0;
                  pfVar16 = pfVar13;
                  do {
                    pfVar3 = pfVar18 + uVar17;
                    uVar17 = uVar17 + 1;
                    auVar26 = vfmadd231ss_fma(auVar26,ZEXT416((uint)*pfVar3),ZEXT416((uint)*pfVar16)
                                             );
                    pfVar16 = pfVar16 + uVar10;
                  } while (uVar10 != uVar17);
                  auVar26 = vmaxss_avx(auVar26,ZEXT816(0) << 0x40);
                  uVar15 = uVar15 + 1;
                  pfVar13 = pfVar13 + 1;
                  pfVar2[lVar14] = auVar26._0_4_;
                  lVar7 = lVar14 + 1;
                } while (uVar15 != uVar10);
                iVar9 = (int)lVar14 + 2;
                uVar11 = uVar11 + 1;
                pfVar18 = pfVar18 + uVar10;
                pfVar2[(int)(lVar14 + 1)] = 1.0;
              } while (uVar11 != uVar10);
            }
          }
          uVar10 = (ulong)(this->super_EigenDecomposition<float,_1>).kCategoryCount;
          lVar12 = lVar12 + 1;
        } while (lVar12 < (long)uVar10);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != (uint)count);
  }
  return;
}

Assistant:

BEAGLE_CPU_EIGEN_TEMPLATE
void EigenDecompositionSquare<BEAGLE_CPU_EIGEN_GENERIC>::updateTransitionMatricesWithModelCategories(int* eigenIndices,
                                                        const int* probabilityIndices,
                                                        const int* firstDerivativeIndices,
                                                        const int* secondDerivativeIndices,
                                                        const double* edgeLengths,
                                                        REALTYPE** transitionMatrices,
                                                        int count) {

    for (int u = 0; u < count; u++) {
        REALTYPE* transitionMat = transitionMatrices[probabilityIndices[u]];
        const double edgeLength = edgeLengths[u];
        int n = 0;
        for (int l = 0; l < kCategoryCount; l++) {
            const REALTYPE distance = edgeLength;
            const REALTYPE* Ievc = gIMatrices[eigenIndices[l]];
            const REALTYPE* Evec = gEMatrices[eigenIndices[l]];
            const REALTYPE* Eval = gEigenValues[eigenIndices[l]];
            const REALTYPE* EvalImag = Eval + kStateCount;
            for(int i=0; i<kStateCount; i++) {
                if (!isComplex || EvalImag[i] == 0) {
                    const REALTYPE tmp = exp(Eval[i] * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[i*kStateCount+j] = Ievc[i*kStateCount+j] * tmp;
                    }
                } else {
                    // 2 x 2 conjugate block
                    int i2 = i + 1;
                    const REALTYPE b = EvalImag[i];
                    const REALTYPE expat = exp(Eval[i] * distance);
                    const REALTYPE expatcosbt = expat * cos(b * distance);
                    const REALTYPE expatsinbt = expat * sin(b * distance);
                    for(int j=0; j<kStateCount; j++) {
                        matrixTmp[ i*kStateCount+j] = expatcosbt * Ievc[ i*kStateCount+j] +
                                                      expatsinbt * Ievc[i2*kStateCount+j];
                        matrixTmp[i2*kStateCount+j] = expatcosbt * Ievc[i2*kStateCount+j] -
                                                      expatsinbt * Ievc[ i*kStateCount+j];
                    }
                    i++; // processed two conjugate rows
                }
            }

#ifdef DEBUG_COMPLEX
            fprintf(stderr,"[");
                for(int i=0; i<16; i++)
                    fprintf(stderr," %7.5e,",matrixTmp[i]);
                fprintf(stderr,"] -- complex debug\n");
                exit(0);
#endif


            for (int i = 0; i < kStateCount; i++) {
                for (int j = 0; j < kStateCount; j++) {
                    REALTYPE sum = 0.0;
                    for (int k = 0; k < kStateCount; k++)
                        sum += Evec[i*kStateCount+k] * matrixTmp[k*kStateCount+j];
                    if (sum > 0)
                        transitionMat[n] = sum;
                    else
                        transitionMat[n] = 0;
                    n++;
                }
if (T_PAD != 0) {
                transitionMat[n] = 1.0;
                n += T_PAD;
}
            }
        }

        if (DEBUGGING_OUTPUT) {
            int kMatrixSize = kStateCount * kStateCount;
            fprintf(stderr,"transitionMat index=%d brlen=%.5f\n", probabilityIndices[u], edgeLengths[u]);
            for ( int w = 0; w < (20 > kMatrixSize ? 20 : kMatrixSize); ++w)
                fprintf(stderr,"transitionMat[%d] = %.5f\n", w, transitionMat[w]);
        }
    }
}